

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmGhsMultiTargetGenerator::~cmGhsMultiTargetGenerator(cmGhsMultiTargetGenerator *this)

{
  cmGhsMultiTargetGenerator *this_local;
  
  ~cmGhsMultiTargetGenerator(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

cmGhsMultiTargetGenerator::~cmGhsMultiTargetGenerator() = default;